

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswread.c
# Opt level: O2

ssw_file_t ssw_open_and_procrec0(char *filename)

{
  char *__s1;
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  uint uVar4;
  long *plVar5;
  uint uVar6;
  char cVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ssw_fileinternal_t *f;
  ulong *puVar14;
  long lVar15;
  void *__ptr;
  ssw_file_t ff;
  FILE *pFVar16;
  ulong uVar17;
  ulong uVar18;
  char *__s2;
  char *pcVar19;
  mcpl_generic_filehandle_t *pmVar20;
  long lVar21;
  long lStack_88;
  size_t local_58;
  char *tmp;
  uint64_t uStack_40;
  undefined8 local_38;
  
  f = (ssw_fileinternal_t *)calloc(1,0x1a0);
  if (f == (ssw_fileinternal_t *)0x0) {
LAB_00102cda:
    ssw_error("memory allocation failure");
  }
  mcpl_generic_fopen(&tmp,filename);
  *(undefined8 *)&(f->filehandle).mode = local_38;
  (f->filehandle).internal = tmp;
  (f->filehandle).current_pos = uStack_40;
  f->lbufmax = 0x400;
  puVar14 = (ulong *)malloc(0x400);
  if (puVar14 == (ulong *)0x0) goto LAB_00102cda;
  pmVar20 = &f->filehandle;
  f->buf = (char *)puVar14;
  mcpl_generic_fread(pmVar20,puVar14,0x24);
  f->reclen = 0;
  uVar4 = (uint)*puVar14;
  uVar18 = (ulong)uVar4;
  f->mcnp_type = 0;
  uVar17 = *puVar14;
  cVar7 = (char)(uVar17 >> 0x20);
  if (uVar18 == 8) {
    if (*(uint *)((long)puVar14 + 0xc) != 8) {
LAB_00102803:
      if (((puVar14[2] != 8) || ((uVar18 = puVar14[3], uVar18 != 0xbf && (uVar18 != 0x8f)))) ||
         ((byte)((char)puVar14[4] + 0x81U) < 0xa1)) goto LAB_0010287d;
      f->mcnp_type = 1;
      f->reclen = 8;
      local_58 = 0x50;
      if (uVar18 == 0xbf) {
        local_58 = 0x80;
      }
      lVar21 = 0x20;
      uVar17 = uVar18;
      goto LAB_00102957;
    }
    uVar6 = (uint)puVar14[2];
    uVar18 = (ulong)uVar6;
    if (((uVar18 != 0xbf) && (uVar6 != 0x8f)) ||
       ((byte)(*(char *)((long)puVar14 + 0x14) + 0x81U) < 0xa1)) goto LAB_00102803;
    f->mcnp_type = 1;
    f->reclen = 4;
    local_58 = 0x50;
    if (uVar6 == 0xbf) {
      local_58 = 0x80;
    }
    lVar21 = 0x14;
LAB_001029b2:
    iVar11 = -0x20;
LAB_001029b5:
    lVar1 = lVar21 + uVar18;
    mcpl_generic_fread(pmVar20,(uint *)((long)puVar14 + 0x24),(long)(iVar11 + (int)lVar1));
    lVar15 = (long)f->reclen;
    if (lVar15 == 4) {
      uVar17 = (ulong)*(uint *)((long)puVar14 + lVar1);
    }
    else {
      uVar17 = *(ulong *)((long)puVar14 + lVar1);
    }
    if (uVar18 == uVar17) {
      if (f->mcnp_type == 2) {
        *(undefined8 *)f->kods = *(undefined8 *)((long)puVar14 + lVar15);
        f->vers[4] = *(char *)((long)puVar14 + lVar15 + 0xc);
        *(undefined4 *)f->vers = *(undefined4 *)((long)puVar14 + lVar15 + 8);
        puVar2 = (undefined8 *)((long)puVar14 + lVar15 + 0xd);
        uVar8 = *puVar2;
        uVar9 = puVar2[1];
        puVar2 = (undefined8 *)((long)puVar14 + lVar15 + 0x19);
        uVar10 = puVar2[1];
        *(undefined8 *)(f->lods + 0xc) = *puVar2;
        *(undefined8 *)(f->lods + 0x14) = uVar10;
        *(undefined8 *)f->lods = uVar8;
        *(undefined8 *)(f->lods + 8) = uVar9;
        puVar2 = (undefined8 *)((long)puVar14 + lVar15 + 0x29);
        uVar8 = puVar2[1];
        *(undefined8 *)f->idtms = *puVar2;
        *(undefined8 *)(f->idtms + 8) = uVar8;
        *(undefined4 *)(f->idtms + 0xf) = *(undefined4 *)((long)puVar14 + lVar15 + 0x38);
        puVar2 = (undefined8 *)((long)puVar14 + lVar15 + 0x3c);
        uVar8 = puVar2[1];
        *(undefined8 *)f->probs = *puVar2;
        *(undefined8 *)(f->probs + 8) = uVar8;
        *(undefined4 *)(f->probs + 0xf) = *(undefined4 *)((long)puVar14 + lVar15 + 0x4b);
        lVar15 = lVar15 + 0x4f;
      }
      else {
        if (f->mcnp_type == 1) {
          *(undefined8 *)f->kods = *(undefined8 *)((long)puVar14 + lVar21);
          f->vers[4] = *(char *)((long)puVar14 + lVar21 + 0xc);
          *(undefined4 *)f->vers = *(undefined4 *)((long)puVar14 + lVar21 + 8);
          puVar2 = (undefined8 *)((long)puVar14 + lVar21 + 0xd);
          uVar8 = puVar2[1];
          puVar3 = (undefined8 *)((long)puVar14 + lVar21 + 0x19);
          uVar9 = *puVar3;
          uVar10 = puVar3[1];
          *(undefined8 *)f->lods = *puVar2;
          *(undefined8 *)(f->lods + 8) = uVar8;
          *(undefined8 *)(f->lods + 0xc) = uVar9;
          *(undefined8 *)(f->lods + 0x14) = uVar10;
          puVar2 = (undefined8 *)((long)puVar14 + lVar21 + 0x29);
          uVar8 = puVar2[1];
          *(undefined8 *)f->idtms = *puVar2;
          *(undefined8 *)(f->idtms + 8) = uVar8;
          *(undefined2 *)(f->idtms + 0x10) = *(undefined2 *)((long)puVar14 + lVar21 + 0x39);
          memcpy(f->aids,(void *)((long)puVar14 + lVar21 + 0x3b),local_58);
          f->probs[0] = '\0';
          goto LAB_00102b0c;
        }
        *(undefined8 *)f->kods = *(undefined8 *)((long)puVar14 + lVar15);
        *(undefined4 *)f->vers = *(undefined4 *)((long)puVar14 + lVar15 + 8);
        f->vers[4] = *(char *)((long)puVar14 + lVar15 + 0xc);
        *(undefined8 *)f->lods = *(undefined8 *)((long)puVar14 + lVar15 + 0xd);
        *(undefined4 *)(f->idtms + 0xf) = *(undefined4 *)((long)puVar14 + lVar15 + 0x24);
        puVar2 = (undefined8 *)((long)puVar14 + lVar15 + 0x15);
        uVar8 = puVar2[1];
        *(undefined8 *)f->idtms = *puVar2;
        *(undefined8 *)(f->idtms + 8) = uVar8;
        puVar2 = (undefined8 *)((long)puVar14 + lVar15 + 0x28);
        uVar8 = puVar2[1];
        *(undefined8 *)f->probs = *puVar2;
        *(undefined8 *)(f->probs + 8) = uVar8;
        *(undefined4 *)(f->probs + 0xf) = *(undefined4 *)((long)puVar14 + lVar15 + 0x37);
        lVar15 = lVar15 + 0x3b;
      }
      memcpy(f->aids,(void *)((long)puVar14 + lVar15),0x50);
LAB_00102b0c:
      pcVar19 = f->kods;
      tmp = pcVar19;
      ssw_strip(&tmp);
      __s1 = f->vers;
      tmp = __s1;
      ssw_strip(&tmp);
      tmp = f->lods;
      ssw_strip(&tmp);
      tmp = f->idtms;
      ssw_strip(&tmp);
      tmp = f->probs;
      ssw_strip(&tmp);
      tmp = f->aids;
      ssw_strip(&tmp);
      __ptr = (void *)mcpl_basename(filename);
      pFVar16 = (FILE *)ssw_impl_stdout_data::thefh;
      if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
        pFVar16 = _stdout;
      }
      fprintf(pFVar16,"ssw_open_file: Opened file \"%s\":\n",__ptr);
      free(__ptr);
      iVar11 = f->mcnp_type;
      __s2 = "mcnp";
      if (iVar11 == 2) {
        __s2 = "mcnpx";
      }
      iVar12 = strcmp(pcVar19,__s2);
      if (iVar12 != 0) {
        pFVar16 = (FILE *)ssw_impl_stdout_data::thefh;
        if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
          pFVar16 = _stdout;
        }
        fprintf(pFVar16,"ssw_open_file WARNING: Unusual MCNP flavour detected (\"%s\").\n",pcVar19);
        iVar11 = f->mcnp_type;
      }
      if (iVar11 == 3) {
        pcVar19 = 
        "ssw_open_file WARNING: Untested MCNP5 source version : \"%s\". (feedback appreciated at https://mctools.github.io/mcpl/contact/)\n"
        ;
        if ((*__s1 == '5') && (f->vers[1] == '\0')) {
          return (ssw_file_t)f;
        }
      }
      else if (iVar11 == 2) {
        iVar11 = strcmp(__s1,"2.5.0");
        if (iVar11 == 0) {
          return (ssw_file_t)f;
        }
        iVar11 = strcmp(__s1,"2.6.0");
        if (iVar11 == 0) {
          return (ssw_file_t)f;
        }
        iVar11 = strcmp(__s1,"2.7.0");
        if (iVar11 == 0) {
          return (ssw_file_t)f;
        }
        iVar11 = strcmp(__s1,"26b");
        if (iVar11 == 0) {
          return (ssw_file_t)f;
        }
        pcVar19 = 
        "ssw_open_file WARNING: Untested MCNPX source version : \"%s\". (feedback appreciated at https://mctools.github.io/mcpl/contact/)\n"
        ;
      }
      else {
        if (iVar11 != 1) {
          return (ssw_file_t)f;
        }
        if ((*__s1 == '6') && (f->vers[1] == '\0')) {
          return (ssw_file_t)f;
        }
        iVar11 = strcmp(__s1,"6.mpi");
        if (iVar11 == 0) {
          return (ssw_file_t)f;
        }
        pcVar19 = 
        "ssw_open_file WARNING: Untested MCNP6 source version : \"%s\". (feedback appreciated at https://mctools.github.io/mcpl/contact/)\n"
        ;
      }
      pFVar16 = (FILE *)ssw_impl_stdout_data::thefh;
      if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
        pFVar16 = _stdout;
      }
      fprintf(pFVar16,pcVar19,__s1);
      return (ssw_file_t)f;
    }
    pcVar19 = "ssw_open_file error: Unexpected header contents\n";
  }
  else {
    if (0xa0 < (byte)(cVar7 + 0x81U) && (uVar4 & 0xfffffffb) == 0xa3) {
      f->mcnp_type = 2;
      f->reclen = 4;
      lVar21 = 4;
      local_58 = 0x50;
      iVar11 = -0x20;
      goto LAB_001029b5;
    }
LAB_0010287d:
    if (((uVar17 & 0xfffffffffffffffb) == 0xa3) && (0xa0 < (byte)((char)puVar14[1] + 0x81U))) {
      f->mcnp_type = 2;
      f->reclen = 8;
      lVar21 = 8;
      local_58 = 0x50;
LAB_00102957:
      pFVar16 = (FILE *)ssw_impl_stdout_data::thefh;
      if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
        pFVar16 = _stdout;
      }
      fwrite("ssw_open_file WARNING: 64bit Fortran records detected which is untested (feedback appreciated at https://mctools.github.io/mcpl/contact/).\n"
             ,0x8b,1,pFVar16);
      iVar11 = f->reclen + -0x24;
      uVar18 = uVar17;
      goto LAB_001029b5;
    }
    if (0xa0 < (byte)(cVar7 + 0x81U) && uVar4 == 0x8f) {
      f->mcnp_type = 3;
      f->reclen = 4;
      uVar18 = 0x8f;
      lVar21 = 4;
      local_58 = 0x50;
      goto LAB_001029b2;
    }
    if ((uVar17 == 0x8f) && (0xa0 < (byte)((char)puVar14[1] + 0x81U))) {
      f->mcnp_type = 3;
      f->reclen = 8;
      uVar17 = 0x8f;
      lVar21 = 8;
      local_58 = 0x50;
      goto LAB_00102957;
    }
    pcVar19 = "ssw_open_file error: File does not look like a supported MCNP SSW file";
  }
  ssw_openerror(f,pcVar19);
  if (f == (ssw_fileinternal_t *)0x0) {
    ssw_error("ssw_open_file called with null string for filename");
  }
  ff = ssw_open_and_procrec0((char *)f);
  iVar11 = ssw_loadrecord((ssw_fileinternal_t *)ff.internal);
  if (iVar11 == 0) {
    pcVar19 = "ssw_open_file error: problems loading record (A)";
    goto LAB_00103072;
  }
  uVar17 = *(ulong *)((long)ff.internal + 0x170);
  lVar21 = *(long *)((long)ff.internal + 0x100) - ((long)*ff.internal + uVar17);
  plVar5 = *(long **)((long)ff.internal + 0x180);
  iVar11 = *(int *)((long)ff.internal + 0xf4);
  if (uVar17 < 0x20 || iVar11 != 1) {
    if (iVar11 == 3) {
      if (uVar17 == 0x28) goto LAB_00102e5f;
      if (uVar17 != 0x20) goto LAB_00103170;
      if (*plVar5 - 0x80000000U < 0xffffffff00000001) {
        pcVar19 = 
        "ssw_open_file error: MCNP5 files with more than 2147483647 histories are not supported";
        goto LAB_00103072;
      }
      *(int *)((long)ff.internal + 0xdc) = (int)*plVar5;
      *(long *)((long)ff.internal + 0x188) = lVar21;
      if ((plVar5[1] & 0xffffffff80000000U) != 0) {
        pcVar19 = 
        "ssw_open_file error: MCNP5 files with more than 2147483647 particles are not supported";
        goto LAB_00103072;
      }
      *(int *)((long)ff.internal + 0xe0) = (int)plVar5[1];
      *(long *)((long)ff.internal + 400) = lVar21 + 8;
      iVar11 = (int)plVar5[2];
      goto LAB_00102d92;
    }
    if (iVar11 == 2) {
      if (uVar17 == 0x28) goto LAB_00102e5f;
      if (uVar17 != 0x14) goto LAB_00103170;
      *(int *)((long)ff.internal + 0xdc) = (int)*plVar5;
      *(long *)((long)ff.internal + 0x188) = lVar21;
      *(undefined4 *)((long)ff.internal + 0xe0) = *(undefined4 *)((long)plVar5 + 4);
      *(long *)((long)ff.internal + 400) = lVar21 + 4;
      iVar11 = (int)plVar5[1];
      lVar21 = 0x10;
      lStack_88 = 0xc;
    }
    else {
      if (uVar17 != 0x28) {
LAB_00103170:
        pcVar19 = "ssw_open_file error: Unexpected record length";
        goto LAB_00103072;
      }
LAB_00102e5f:
      pFVar16 = (FILE *)ssw_impl_stdout_data::thefh;
      if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
        pFVar16 = _stdout;
      }
      fwrite("ssw_open_file WARNING: File format has header format for which decoding was never tested (feedback appreciated at https://mctools.github.io/mcpl/contact/).\n"
             ,0x9c,1,pFVar16);
      *(int *)((long)ff.internal + 0xdc) = (int)*plVar5;
      *(long *)((long)ff.internal + 0x188) = lVar21;
      *(int *)((long)ff.internal + 0xe0) = (int)plVar5[1];
      *(long *)((long)ff.internal + 400) = lVar21 + 8;
      iVar11 = (int)plVar5[2];
      lVar21 = 0x20;
      lStack_88 = 0x18;
    }
  }
  else {
    *(int *)((long)ff.internal + 0xdc) = (int)*plVar5;
    *(long *)((long)ff.internal + 0x188) = lVar21;
    *(int *)((long)ff.internal + 0xe0) = (int)plVar5[1];
    *(long *)((long)ff.internal + 400) = lVar21 + 8;
    iVar12 = (int)plVar5[2];
    iVar11 = -iVar12;
    if (0 < iVar12) {
      iVar11 = iVar12;
    }
LAB_00102d92:
    lVar21 = 0x18;
    lStack_88 = 0x14;
  }
  *(int *)((long)ff.internal + 0xe8) = iVar11;
  *(undefined4 *)((long)ff.internal + 0xe4) = *(undefined4 *)((long)plVar5 + lStack_88);
  *(undefined4 *)((long)ff.internal + 0xec) = *(undefined4 *)((long)plVar5 + lVar21);
  pmVar20 = (mcpl_generic_filehandle_t *)&stdout;
  pFVar16 = (FILE *)ssw_impl_stdout_data::thefh;
  if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
    pFVar16 = _stdout;
  }
  pcVar19 = ssw_mcnpflavour(ff);
  fprintf(pFVar16,"ssw_open_file:    File layout detected : %s\n",pcVar19);
  pFVar16 = (FILE *)ssw_impl_stdout_data::thefh;
  if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
    pFVar16 = _stdout;
  }
  fprintf(pFVar16,"ssw_open_file:    Code ID fields : \"%s\" / \"%s\"\n",(long)ff.internal + 4,
          (long)ff.internal + 0xd);
  pFVar16 = (FILE *)ssw_impl_stdout_data::thefh;
  if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
    pFVar16 = _stdout;
  }
  fprintf(pFVar16,"ssw_open_file:    Title field : \"%s\"\n",(long)ff.internal + 0x58);
  pFVar16 = (FILE *)ssw_impl_stdout_data::thefh;
  if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
    pFVar16 = _stdout;
  }
  uVar4 = *(uint *)((long)ff.internal + 0xdc);
  uVar6 = -uVar4;
  if (0 < (int)uVar4) {
    uVar6 = uVar4;
  }
  fprintf(pFVar16,"ssw_open_file:    Source statistics (histories): %11i\n",(ulong)uVar6);
  pFVar16 = (FILE *)ssw_impl_stdout_data::thefh;
  if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
    pFVar16 = _stdout;
  }
  fprintf(pFVar16,"ssw_open_file:    Particles in file            : %11i\n",
          (ulong)*(uint *)((long)ff.internal + 0xe0));
  pFVar16 = (FILE *)ssw_impl_stdout_data::thefh;
  if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
    pFVar16 = _stdout;
  }
  fprintf(pFVar16,"ssw_open_file:    Number of surfaces           : %11i\n",
          (ulong)*(uint *)((long)ff.internal + 0xe4));
  pFVar16 = (FILE *)ssw_impl_stdout_data::thefh;
  if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
    pFVar16 = _stdout;
  }
  fprintf(pFVar16,"ssw_open_file:    Histories at surfaces        : %11i\n",
          (ulong)*(uint *)((long)ff.internal + 0xec));
  uVar4 = *(uint *)((long)ff.internal + 0xe8);
  if (uVar4 == 6) {
    pcVar19 = "ssw_open_file error: SSW files with spherical sources are not currently supported.";
  }
  else if ((int)uVar4 < 10) {
    pcVar19 = "ssw_open_file error: Too short SSB arrays in file";
  }
  else if (uVar4 < 0xc) {
    if (uVar4 == 10 && *(int *)((long)ff.internal + 0xf4) == 1) {
      pcVar19 = "ssw_open_file error: Unexpected length of SSB arrays in MCNP6 file";
    }
    else {
      iVar11 = *(int *)((long)ff.internal + 0xdc);
      if (iVar11 == 0) {
        pcVar19 = "ssw_open_file error: File has 0 particle histories which should not be possible";
      }
      else {
        iVar12 = 0;
        if (iVar11 < 0) {
          *(int *)((long)ff.internal + 0xdc) = -iVar11;
          iVar11 = ssw_loadrecord((ssw_fileinternal_t *)ff.internal);
          if (iVar11 == 0) {
            pcVar19 = "ssw_open_file error: problems loading record (B)";
            goto LAB_00103072;
          }
          iVar12 = (int)*plVar5;
        }
        iVar11 = -1;
        do {
          iVar11 = iVar11 + 1;
          if (*(int *)((long)ff.internal + 0xe4) + iVar12 < iVar11) goto LAB_0010307a;
          iVar13 = ssw_loadrecord((ssw_fileinternal_t *)ff.internal);
        } while (iVar13 != 0);
        pcVar19 = "ssw_open_file error: problems loading record (C)";
      }
    }
  }
  else {
    pcVar19 = "ssw_open_file error: Unexpected length of SSB arrays in file";
  }
LAB_00103072:
  do {
    ssw_openerror((ssw_fileinternal_t *)ff.internal,pcVar19);
LAB_0010307a:
    *(undefined4 *)((long)ff.internal + 0xf0) = 0;
    *(undefined8 *)((long)ff.internal + 0x198) = *(undefined8 *)((long)ff.internal + 0x100);
    iVar11 = -3;
    while( true ) {
      if (iVar11 == 0) {
        return (ssw_file_t)ff.internal;
      }
      iVar12 = ssw_loadrecord((ssw_fileinternal_t *)ff.internal);
      if (iVar12 == 0) break;
      if ((0 < *(int *)((long)ff.internal + 0xe0)) &&
         (*(ulong *)((long)ff.internal + 0x170) ==
          (ulong)(uint)(*(int *)((long)ff.internal + 0xe8) << 3))) {
        return (ssw_file_t)ff.internal;
      }
      *(long *)((long)ff.internal + 0x198) =
           *(long *)((long)ff.internal + 0x198) +
           *(ulong *)((long)ff.internal + 0x170) + (long)*ff.internal * 2;
      pFVar16 = (FILE *)ssw_impl_stdout_data::thefh;
      if (ssw_impl_stdout_data::thefh == (FILE *)0x0) {
        pFVar16 = (FILE *)pmVar20->internal;
      }
      fprintf(pFVar16,
              "ssw_open_file WARNING: Unexpected %llu byte record encountered at end of header. Continuing under the assumption it contains valid configuration data.\n"
             );
      iVar11 = iVar11 + 1;
    }
    if (*(int *)((long)ff.internal + 0xe0) == 0) {
      return (ssw_file_t)ff.internal;
    }
    pcVar19 = "ssw_open_file error: problems loading record (D)";
  } while( true );
}

Assistant:

ssw_file_t ssw_open_and_procrec0( const char * filename )
{
  ssw_fileinternal_t * f = (ssw_fileinternal_t*)calloc(1,sizeof(ssw_fileinternal_t));
  if (!f)
    ssw_error("memory allocation failure");
  f->filehandle.internal = NULL;

  ssw_file_t out;
  out.internal = f;

  //open file (can be gzipped if filename ends with .gz):
  f->filehandle = mcpl_generic_fopen( filename );

  //Prepare buffer. SSWREAD_STDBUFSIZE bytes should always be enough for the
  //first record (guaranteed by the checks below), but it might later grow on
  //demand inside ssw_loadrecord if needed.

  f->lbufmax = SSWREAD_STDBUFSIZE;
  char * buf = malloc(f->lbufmax);
  if (!buf)
    ssw_error("memory allocation failure");
  f->buf = buf;

  //Fortran data is usually written in "records" with an initial and final 32bit
  //or 64bit integer specifying the record byte-length. The tested file-types
  //begin in one of the following ways:
  //
  // 1) 4B[163|167] + KODS : MCNPX2.7.0 with 32bit reclen
  // 2) 8B[163|167] + KODS : MCNPX2.7.0 with 64bit reclen
  // 3) 16B +4B[143 or 191] + KODS : MCNP6 with 32bit reclen
  // 4) 24B +8B[143 or 191] + KODS : MCNP6 with 64bit reclen
  // 5) 4B[143]+KODS : MCNP5 with 32bit reclen.
  // 6) 8B[143]+KODS : MCNP5 with 64bit reclen.
  //
  //Where KODS is 8 bytes representing the "code name" as a string. For pure
  //MCNPX/MCNP6 this string contains "mcnpx" and "mcnp" respectively, but we
  //should allow for custom in-house versions with modified contents of KODS. We
  //do, however, require that the first character or KODS is an ASCII character
  //in the range 32-126 (i.e. non-extended ascii without control or null chars).
  //
  //Note that for option 3) and 4), the second record can have a length of
  //either 143 (MCNP 6.0) or 191 (MCNP 6.2), since the "aids" field increased in
  //size from 80 to 128 chars.
  //
  //Note that for option 3) and 4), the 16B / 24B are a fortran record with 8
  //bytes of data - usually (always?) the string "SF_00001".

  //Thus, we probe the first 36 bytes and search the patterns above:

  ssw_readbytes(f,buf,36);
  uint32_t first32 = *((uint32_t*)buf);
  uint64_t first64 = *((uint64_t*)buf);

  f->reclen = 0;
  f->mcnp_type = SSW_MCNP_NOTFOUND;
  uint64_t lenrec0 = 99999;
  unsigned rec0begin = 0;

  //First look for MCNP6:
  unsigned mcnp6_lenaids = 80;
  if ( first32==8 && *((uint32_t*)(buf+12))==8 && (*((uint32_t*)(buf+16))==143||*((uint32_t*)(buf+16))==191) && buf[20]>=32 && buf[20]<127) {
    //Looks like 3), an mcnp6 file with 32bit fortran records.
    f->mcnp_type = SSW_MCNP6;
    f->reclen = 4;
    lenrec0 = *((uint32_t*)(buf+16));
    rec0begin = 20;
    if (*((uint32_t*)(buf+16))==191)
      mcnp6_lenaids = 128;
  } else if ( first32==8 && *((uint64_t*)(buf+16))==8 && (*((uint64_t*)(buf+24))==143||*((uint64_t*)(buf+24))==191) && buf[32]>=32 && buf[32]<127) {
    //Looks like 4), an mcnp6 file with 64bit fortran records.
    f->mcnp_type = SSW_MCNP6;
    f->reclen = 8;
    lenrec0 = *((uint64_t*)(buf+24));
    rec0begin = 32;
    if (*((uint64_t*)(buf+24))==191)
      mcnp6_lenaids = 128;
  }

  //Next, look for MCNPX:
  if ( f->mcnp_type == SSW_MCNP_NOTFOUND ) {
    if ( (first32==163||first32==167) && ( buf[4]>=32 && buf[4]<127 ) ) {
      //Looks like 1), an mcnpx file with 32bit fortran records.
      f->mcnp_type = SSW_MCNPX;
      f->reclen = 4;
      lenrec0 = first32;
      rec0begin = 4;
    } else if ( (first64==163||first64==167) && ( buf[8]>=32 && buf[8]<127 ) ) {
      //Looks like 2), an mcnpx file with 64bit fortran records.
      f->mcnp_type = SSW_MCNPX;
      f->reclen = 8;
      lenrec0 = first64;
      rec0begin = 8;
    }
  }

  //Finally, look for MCNP5:
  if ( f->mcnp_type == SSW_MCNP_NOTFOUND ) {
    if ( first32==143 && ( buf[4]>=32 && buf[4]<127 ) ) {
      //Looks like 5), an mcnp5 file with 32bit fortran records.
      f->mcnp_type = SSW_MCNP5;
      f->reclen = 4;
      lenrec0 = first32;
      rec0begin = 4;
    } else if ( first64==143 && ( buf[8]>=32 && buf[8]<127 ) ) {
      //Looks like 6), an mcnp5 file with 64bit fortran records.
      f->mcnp_type = SSW_MCNP5;
      f->reclen = 8;
      lenrec0 = first64;
      rec0begin = 8;
    }
  }

  if ( f->mcnp_type == SSW_MCNP_NOTFOUND )
    ssw_openerror(f,"ssw_open_file error: File does not"
                  " look like a supported MCNP SSW file");

  assert(f->reclen && rec0begin && lenrec0 && lenrec0<99999 );

  if (f->reclen==8) {
    fprintf(ssw_stdout(),"ssw_open_file WARNING: 64bit Fortran records detected which is untested (feedback"
            " appreciated at https://mctools.github.io/mcpl/contact/).\n");
  }

  //Finish reading the first record:
  int missingrec0 = (int)(lenrec0 + rec0begin) - (int)36 + f->reclen;
  assert(missingrec0>0);
  ssw_readbytes(f,buf+36,missingrec0);

  //Check final marker:
  uint64_t lenrec0_b;
  if (f->reclen==4)
    lenrec0_b = *((uint32_t*)(buf+(rec0begin+lenrec0)));
  else
    lenrec0_b = *((uint64_t*)(buf+(rec0begin+lenrec0)));
  if (lenrec0!=lenrec0_b)
    ssw_openerror(f,"ssw_open_file error: Unexpected header contents\n");

  //decode first record, inspired by ssw.py:
  if (f->mcnp_type == SSW_MCNP6) {
    char * r = buf + rec0begin;
    unsigned n;
    memcpy(f->kods,r, n=8); r += n;
    memcpy(f->vers,r, n=5); r += n;
    memcpy(f->lods,r, n=28); r += n;
    memcpy(f->idtms,r, n=18); r += n;
    memcpy(f->aids,r, n=mcnp6_lenaids);
    f->probs[0]='\0';
  } else if (f->mcnp_type == SSW_MCNPX) {
    assert(lenrec0==163||lenrec0==167);
    char * r = buf + f->reclen;
    unsigned n;
    memcpy(f->kods,r, n=8); r += n;
    memcpy(f->vers,r, n=5); r += n;
    memcpy(f->lods,r, n=28); r += n;
    memcpy(f->idtms,r, n=19); r += n;
    memcpy(f->probs,r, n=19); r += n;
    memcpy(f->aids,r, n=80);
  } else {
    assert(f->mcnp_type == SSW_MCNP5);
    assert(lenrec0==143);
    char * r = buf + f->reclen;
    unsigned n;
    memcpy(f->kods,r, n=8); r += n;
    memcpy(f->vers,r, n=5); r += n;
    memcpy(f->lods,r, n=8); r += n;
    memcpy(f->idtms,r, n=19); r += n;
    memcpy(f->probs,r, n=19); r += n;
    memcpy(f->aids,r, n=80);
  }

  char * tmp;
  tmp = f->kods; ssw_strip(&tmp);
  tmp = f->vers; ssw_strip(&tmp);
  tmp = f->lods; ssw_strip(&tmp);
  tmp = f->idtms; ssw_strip(&tmp);
  tmp = f->probs; ssw_strip(&tmp);
  tmp = f->aids; ssw_strip(&tmp);
  char * bn = mcpl_basename(filename);
  fprintf(ssw_stdout(),"ssw_open_file: Opened file \"%s\":\n",bn);
  free(bn);
  const char * expected_kods = (f->mcnp_type == SSW_MCNPX?"mcnpx":"mcnp");
  if (strcmp(f->kods,expected_kods)!=0) {
    fprintf(ssw_stdout(),"ssw_open_file WARNING: Unusual MCNP flavour detected (\"%s\").\n",f->kods);
  }

  if (f->mcnp_type==SSW_MCNP6) {
    if ( strcmp(f->vers,"6")!=0 && strcmp(f->vers,"6.mpi")!=0 ) {
      fprintf(ssw_stdout(),"ssw_open_file WARNING: Untested MCNP6 source version : \"%s\". (feedback"
              " appreciated at https://mctools.github.io/mcpl/contact/)\n",f->vers);
    }
  } else if (f->mcnp_type==SSW_MCNPX) {
    if ( strcmp(f->vers,"2.5.0")!=0 && strcmp(f->vers,"2.6.0")!=0
         && strcmp(f->vers,"2.7.0")!=0 && strcmp(f->vers,"26b")!=0 )
      fprintf(ssw_stdout(),"ssw_open_file WARNING: Untested MCNPX source version : \"%s\". (feedback"
              " appreciated at https://mctools.github.io/mcpl/contact/)\n",f->vers);
  } else if (f->mcnp_type==SSW_MCNP5) {
    if ( strcmp(f->vers,"5")!=0 )
      fprintf(ssw_stdout(),"ssw_open_file WARNING: Untested MCNP5 source version : \"%s\". (feedback"
              " appreciated at https://mctools.github.io/mcpl/contact/)\n",f->vers);
  }

  return out;
}